

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

bool __thiscall Clasp::mt::ParallelHandler::isModel(ParallelHandler *this,Solver *s)

{
  bool bVar1;
  uint32 uVar2;
  uint32 *unaff_retaddr;
  undefined1 local_11;
  
  bVar1 = ParallelSolve::integrateModels((ParallelSolve *)this,s,unaff_retaddr);
  local_11 = false;
  if (bVar1) {
    uVar2 = Solver::numFreeVars((Solver *)0x21f3b2);
    local_11 = false;
    if (uVar2 == 0) {
      uVar2 = Solver::queueSize((Solver *)0x21f3c9);
      local_11 = uVar2 == 0;
    }
  }
  return local_11;
}

Assistant:

bool ParallelHandler::isModel(Solver& s) {
	assert(s.numFreeVars() == 0);
	// either no unprocessed updates or still a model after
	// updates were integrated
	return ctrl_->integrateModels(s, gp_.modCount)
		&& s.numFreeVars() == 0
		&& s.queueSize()   == 0;
}